

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-sdg-dump.cpp
# Opt level: O0

void __thiscall SDGDumper::dumpToDot(SDGDumper *this,char *suffix)

{
  SystemDependenceGraph *in_RSI;
  SDG2Dot *in_RDI;
  SDG2Dot dumper;
  string fl;
  string *in_stack_00000388;
  SDG2Dot *in_stack_00000390;
  SystemDependenceGraph *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff48;
  raw_ostream *in_stack_ffffffffffffff50;
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  SystemDependenceGraph *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string
            (local_30,(string *)
                      &in_RDI->_llvmsdg[1]._rev_mapping._M_t._M_impl.super__Rb_tree_header._M_header
                       ._M_right);
  if (local_10 == (SystemDependenceGraph *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,".dot",&local_79);
    replace_suffix(local_30,local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,(char *)local_10,&local_51);
    replace_suffix(local_30,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    in_stack_ffffffffffffff38 = local_10;
  }
  llvm::errs();
  llvm::raw_ostream::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  llvm::raw_ostream::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  llvm::raw_ostream::operator<<(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  if (((in_RDI->dumpedNodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color & _S_black) ==
      _S_red) {
    dg::llvmdg::SDG2Dot::SDG2Dot(in_RDI,in_stack_ffffffffffffff38);
    dg::llvmdg::SDG2Dot::dump(in_stack_00000390,in_stack_00000388);
    dg::llvmdg::SDG2Dot::~SDG2Dot((SDG2Dot *)0x1629bc);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void dumpToDot(const char *suffix = nullptr) {
        // compose new name
        std::string fl(options.inputFile);
        if (suffix)
            replace_suffix(fl, suffix);
        else
            replace_suffix(fl, ".dot");

        errs() << "Dumping SDG to " << fl << "\n";

        if (bb_only) {
            assert(false && "Not implemented");
            // SDGDumpBlocks dumper(dg, dump_opts, fl.c_str());
            // dumper.dump();
        } else {
            llvmdg::SDG2Dot dumper(dg);
            dumper.dump(fl);
        }
    }